

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

bool __thiscall flexbuffers::Reference::MutateString(Reference *this,char *str,size_t len)

{
  bool bVar1;
  String s;
  String local_38;
  
  AsString(&local_38,this);
  bVar1 = local_38.super_Sized.super_Object.data_ != String::EmptyString()::empty_string;
  if (local_38.super_Sized.size_ == len && bVar1) {
    memcpy(local_38.super_Sized.super_Object.data_,str,len);
  }
  return local_38.super_Sized.size_ == len && bVar1;
}

Assistant:

bool MutateString(const char *str, size_t len) {
    auto s = AsString();
    if (s.IsTheEmptyString()) return false;
    // This is very strict, could allow shorter strings, but that creates
    // garbage.
    if (s.length() != len) return false;
    memcpy(const_cast<char *>(s.c_str()), str, len);
    return true;
  }